

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O1

void ZopfliLZ77GetHistogramAt(ZopfliLZ77Store *lz77,size_t lpos,size_t *ll_counts,size_t *d_counts)

{
  size_t *psVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = lpos / 9 & 0xffffffffffffffe0;
  psVar1 = lz77->ll_counts;
  lVar3 = 0;
  do {
    ll_counts[lVar3] = psVar1[uVar2 * 9 + lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x120);
  uVar5 = lpos & 0xffffffffffffffe0;
  uVar4 = lpos + 1;
  if (uVar4 < uVar2 * 9 + 0x120) {
    uVar2 = uVar4;
    do {
      if (lz77->size <= uVar2) break;
      ll_counts[lz77->ll_symbol[uVar2]] = ll_counts[lz77->ll_symbol[uVar2]] - 1;
      lVar3 = (lpos / 9 & 0xffffffffffffffe0) * -9 + uVar2;
      uVar2 = uVar2 + 1;
    } while (lVar3 != 0x11f);
  }
  psVar1 = lz77->d_counts;
  lVar3 = 0;
  do {
    d_counts[lVar3] = psVar1[uVar5 + lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  if (uVar4 < uVar5 + 0x20) {
    do {
      if (lz77->size <= uVar4) {
        return;
      }
      if (lz77->dists[uVar4] != 0) {
        d_counts[lz77->d_symbol[uVar4]] = d_counts[lz77->d_symbol[uVar4]] - 1;
      }
      lVar3 = uVar4 - uVar5;
      uVar4 = uVar4 + 1;
    } while (lVar3 != 0x1f);
  }
  return;
}

Assistant:

static void ZopfliLZ77GetHistogramAt(const ZopfliLZ77Store* lz77, size_t lpos,
                                     size_t* ll_counts, size_t* d_counts) {
  /* The real histogram is created by using the histogram for this chunk, but
  all superfluous values of this chunk subtracted. */
  size_t llpos = ZOPFLI_NUM_LL * (lpos / ZOPFLI_NUM_LL);
  size_t dpos = ZOPFLI_NUM_D * (lpos / ZOPFLI_NUM_D);
  size_t i;
  for (i = 0; i < ZOPFLI_NUM_LL; i++) {
    ll_counts[i] = lz77->ll_counts[llpos + i];
  }
  for (i = lpos + 1; i < llpos + ZOPFLI_NUM_LL && i < lz77->size; i++) {
    ll_counts[lz77->ll_symbol[i]]--;
  }
  for (i = 0; i < ZOPFLI_NUM_D; i++) {
    d_counts[i] = lz77->d_counts[dpos + i];
  }
  for (i = lpos + 1; i < dpos + ZOPFLI_NUM_D && i < lz77->size; i++) {
    if (lz77->dists[i] != 0) d_counts[lz77->d_symbol[i]]--;
  }
}